

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O3

string * __thiscall
higan::HttpRequest::GetMethodString_abi_cxx11_(string *__return_storage_ptr__,HttpRequest *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"ERROR","");
  if ((ulong)this->method_ < 5) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)(&DAT_0010714c + *(int *)(&DAT_0010714c + (ulong)this->method_ * 4)));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpRequest::GetMethodString() const
{
	std::string result = "ERROR";
	switch (method_)
	{
		case HTTP_REQUEST_UNKNOWN:
			result = "UNKNOWN";
			break;
		case HTTP_REQUEST_GET:
			result = "GET";
			break;
		case HTTP_REQUEST_POST:
			result = "POST";
			break;
		case HTTP_REQUEST_PUT:
			result = "PUT";
			break;
		case HTTP_REQUEST_DELETE:
			result = "DELETE";
			break;
	}

	return result;
}